

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argtable3.c
# Opt level: O3

int arg_cmd_dispatch(char *name,int argc,char **argv,arg_dstr_t res)

{
  int iVar1;
  void *pvVar2;
  
  pvVar2 = arg_hashtable_search(s_hashtable,name);
  if (pvVar2 == (void *)0x0) {
    __assert_fail("cmd_info != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/minlux[P]dymon/libs/argtable3/argtable3.c"
                  ,0x12e0,"int arg_cmd_dispatch(const char *, int, char **, arg_dstr_t)");
  }
  if (*(code **)((long)pvVar2 + 0x168) != (code *)0x0) {
    iVar1 = (**(code **)((long)pvVar2 + 0x168))(argc,argv,res);
    return iVar1;
  }
  __assert_fail("cmd_info->proc != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/minlux[P]dymon/libs/argtable3/argtable3.c"
                ,0x12e1,"int arg_cmd_dispatch(const char *, int, char **, arg_dstr_t)");
}

Assistant:

int arg_cmd_dispatch(const char* name, int argc, char* argv[], arg_dstr_t res) {
    arg_cmd_info_t* cmd_info = arg_cmd_info(name);

    assert(cmd_info != NULL);
    assert(cmd_info->proc != NULL);

    return cmd_info->proc(argc, argv, res);
}